

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::setStateWeight(L2NormCost *this,MatrixDynSize *stateWeights)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  
  lVar2 = iDynTree::MatrixDynSize::rows();
  lVar3 = iDynTree::MatrixDynSize::cols();
  if (lVar2 == lVar3) {
    if ((this->m_pimpl->stateCost).m_valid == true) {
      bVar1 = CostAttributes::setWeightMatrix(&this->m_pimpl->stateCost,stateWeights);
      if (bVar1) {
        return true;
      }
      pcVar4 = "Error when specifying the state weights.";
    }
    else {
      pcVar4 = "The state cost portion has been deactivated, given the provided selectors.";
    }
  }
  else {
    pcVar4 = "The stateWeights matrix is supposed to be squared.";
  }
  iDynTree::reportError("L2NormCost","setStateWeight",pcVar4);
  return false;
}

Assistant:

bool L2NormCost::setStateWeight(const MatrixDynSize &stateWeights)
        {
            if (stateWeights.rows() != stateWeights.cols()) {
                reportError("L2NormCost", "setStateWeight", "The stateWeights matrix is supposed to be squared.");
                return false;
            }

            if (!(m_pimpl->stateCost.isValid())) {
                reportError("L2NormCost", "setStateWeight", "The state cost portion has been deactivated, given the provided selectors.");
                return false;
            }

            if (!(m_pimpl->stateCost.setWeightMatrix(stateWeights))) {
                reportError("L2NormCost", "setStateWeight", "Error when specifying the state weights.");
                return false;
            }

            return true;
        }